

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O3

void __thiscall
glslang::TBuiltIns::add2ndGenerationSamplingImaging
          (TBuiltIns *this,int version,EProfile profile,SpvVersion *spvVersion)

{
  undefined3 uVar1;
  EProfile profile_00;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  byte bVar5;
  bool bVar6;
  undefined7 uVar9;
  undefined8 uVar8;
  ulong uVar10;
  uint uVar11;
  undefined8 in_R8;
  ulong uVar12;
  undefined8 uVar13;
  bool bVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  bool bVar19;
  TString typeName;
  TString textureTypeName;
  TSampler local_104;
  bool local_ff;
  byte local_fe;
  undefined1 local_fd;
  uint local_fc;
  uint local_f8;
  EProfile local_f4;
  TBuiltIns *local_f0;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  SpvVersion *local_d8;
  undefined8 local_d0;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  int local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  TString local_80;
  TString local_58;
  ulong uVar7;
  
  uVar13 = CONCAT71((int7)((ulong)in_R8 >> 8),1);
  local_d0 = 0;
  bVar14 = false;
  local_ff = true;
  if (0x135 < version || profile != EEsProfile) {
    bVar14 = profile == EEsProfile || 0x8b < version;
    local_ff = version < 0x82 && profile != EEsProfile;
  }
  local_fd = version < 0x1c2 || profile == EEsProfile;
  uVar8 = CONCAT71((int7)((ulong)spvVersion >> 8),local_fd);
  uVar15 = (ulong)(byte)~bVar14;
  uVar3 = 0;
  local_fc = version;
  local_f4 = profile;
  local_f0 = this;
  local_d8 = spvVersion;
  local_90 = uVar15;
  do {
    local_c8 = (uint)uVar13;
    local_bc = ((byte)~(byte)uVar3 & 1) * 0x80000 + 0x1f080000;
    uVar13 = 0;
    uVar8 = CONCAT71((int7)((ulong)uVar8 >> 8),1);
    uVar11 = 0;
    local_98 = uVar3;
    do {
      local_c4 = (uint)uVar8;
      local_ac = uVar11 | (uint)local_d0;
      local_e4 = (uint)uVar13;
      local_b0 = (local_e4 & 1) << 0x11;
      uVar3 = 0;
      local_e0 = (uint)CONCAT71((uint7)(uint3)((uint)local_b0 >> 8),1);
      local_f8 = 0;
      local_c0 = uVar11;
      do {
        bVar14 = local_f8 != 0 || (uint)local_d0 != 0;
        uVar1 = (undefined3)((ulong)local_d0 >> 8);
        uVar2 = (ulong)CONCAT31(uVar1,bVar14);
        if (((byte)local_e4 & bVar14) == 0) {
          bVar14 = version < 0x8c;
          bVar6 = version < 0x136;
          bVar19 = profile == EEsProfile;
          uVar2 = (ulong)CONCAT31(uVar1,bVar19);
          bVar4 = (byte)uVar3;
          uVar12 = (ulong)CONCAT31(uVar1,local_fd);
          version = local_fc;
          if (((bVar6 & bVar19 & bVar4) != 0) || ((bVar14 & !bVar19 & bVar4) != 0)) break;
          bVar4 = (byte)local_98 & bVar4;
          uVar7 = CONCAT71((int7)(local_98 >> 8),bVar4);
          bVar4 = bVar19 & bVar4;
          uVar2 = (ulong)CONCAT31(uVar1,bVar4);
          if (bVar4 != 0) break;
          local_f8 = local_f8 | local_c0;
          local_dc = (uint)uVar3;
          local_b8 = (local_dc & 1) * 0x40000;
          local_88 = (ulong)local_b8;
          local_b8 = local_b8 + 0x1f080700;
          uVar10 = 0;
          uVar2 = CONCAT71((uint7)(uint3)(local_b8 >> 8),1);
          uVar11 = 0;
          do {
            local_a4 = (uint)uVar2;
            uVar7 = CONCAT71((int7)(uVar7 >> 8),profile == EEsProfile);
            local_9c = local_ac | uVar11;
            local_a0 = uVar11 | local_f8;
            bVar4 = (byte)uVar3 & (byte)uVar10 & profile == EEsProfile & version < 0x136;
            local_a8 = (uint)uVar10;
            iVar17 = 1;
            iVar16 = (local_a8 & 1) * 0x10000 + local_b0 + (int)local_88;
            do {
              if (iVar17 == 8) break;
              if ((iVar17 != 7) || (spvVersion->vulkan != 0)) {
                if (iVar17 == 7) {
                  if (local_9c == 0) {
                    bVar14 = false;
LAB_003fc414:
                    if (((((local_dc & 1) == 0) || (iVar17 == 7)) || (iVar17 == 2)) &&
                       (((byte)uVar15 & iVar17 == 6) == 0)) {
                      uVar9 = (undefined7)(uVar7 >> 8);
                      bVar5 = (local_a0 != 0 && iVar17 == 6) | bVar4;
                      uVar7 = CONCAT71(uVar9,bVar5);
                      if ((bVar5 == 0) && (((byte)local_e4 & iVar17 == 3) == 0)) {
                        bVar5 = iVar17 == 4 & local_ff;
                        uVar7 = CONCAT71(uVar9,bVar5);
                        if (((byte)local_a8 & (iVar17 == 3 | bVar14 | bVar5)) == 0) {
                          local_b4 = iVar17 << 8;
                          uVar10 = 0xffffffffffffffff;
                          lVar18 = 0;
                          local_fe = bVar4;
                          do {
                            if (((byte)uVar12 & lVar18 == 0xc) != 0) break;
                            bVar6 = lVar18 != 0 && version < 0x8c;
                            uVar7 = CONCAT71((int7)(uVar7 >> 8),bVar6);
                            if (((bVar14 & bVar6) == 0) && (((byte)local_e4 & uVar10 < 2) == 0)) {
                              if (iVar17 == 7) {
                                local_104 = (TSampler)((byte)(&DAT_007040c0)[lVar18] | local_b8);
                                TSampler::getString_abi_cxx11_(&local_80,&local_104);
                                addSubpassSampling(local_f0,local_104,&local_80,(int)uVar7,
                                                   (EProfile)uVar12);
                              }
                              else {
                                local_104 = (TSampler)
                                            (((byte)(&DAT_007040c0)[lVar18] | local_b4) + iVar16 |
                                            local_bc);
                                TSampler::getString_abi_cxx11_(&local_80,&local_104);
                                profile_00 = local_f4;
                                addQueryFunctions(local_f0,local_104,&local_80,local_fc,local_f4);
                                uVar11 = local_fc;
                                if ((local_98 & 1) == 0) {
                                  addSamplingFunctions
                                            (local_f0,local_104,&local_80,local_fc,profile_00);
                                  uVar7 = (ulong)uVar11;
                                  uVar12 = (ulong)local_f4;
                                  addGatherFunctions(local_f0,local_104,&local_80,uVar11,local_f4);
                                  bVar4 = local_fe;
                                  if ((0 < local_d8->vulkan) &&
                                     (uVar7 = (ulong)((uint)local_104 & 0x120000),
                                     ((uint)local_104 & 0x120000) == 0x100000)) {
                                    local_104 = (TSampler)
                                                ((uint)local_104 & 0x8005ffff | 0x1f000000);
                                    TSampler::getString_abi_cxx11_(&local_58,&local_104);
                                    addSamplingFunctions
                                              (local_f0,local_104,&local_58,local_fc,local_f4);
                                    uVar7 = (ulong)local_fc;
                                    uVar12 = (ulong)local_f4;
                                    addQueryFunctions(local_f0,local_104,&local_58,local_fc,local_f4
                                                     );
                                  }
                                }
                                else {
                                  uVar7 = (ulong)local_fc;
                                  uVar12 = (ulong)profile_00;
                                  addImageFunctions(local_f0,local_104,&local_80,local_fc,profile_00
                                                   );
                                  bVar4 = local_fe;
                                }
                              }
                              uVar12 = CONCAT71((int7)(uVar12 >> 8),local_fd);
                              this = local_f0;
                              spvVersion = local_d8;
                              uVar15 = local_90;
                              version = local_fc;
                              profile = local_f4;
                            }
                            lVar18 = lVar18 + 4;
                            uVar10 = uVar10 + 1;
                          } while (lVar18 != 0x10);
                        }
                      }
                    }
                  }
                }
                else {
                  bVar14 = iVar17 == 5;
                  uVar7 = uVar7 & 0xffffffffffffff00;
                  if (profile != EEsProfile || iVar17 != 1 && !bVar14) goto LAB_003fc414;
                }
              }
              iVar17 = iVar17 + 1;
            } while (iVar17 != 9);
            uVar11 = 1;
            uVar10 = CONCAT71((int7)(uVar10 >> 8),1);
            uVar2 = 0;
            uVar3 = (ulong)local_dc;
          } while ((local_a4 & 1) != 0);
        }
        local_f8 = 1;
        uVar3 = CONCAT71((int7)(uVar3 >> 8),1);
        uVar11 = local_e0 & 1;
        local_e0 = 0;
      } while (uVar11 != 0);
      uVar11 = 1;
      uVar13 = CONCAT71((int7)(uVar2 >> 8),1);
      uVar8 = 0;
    } while ((local_c4 & 1) != 0);
    local_d0 = 1;
    uVar3 = 1;
    uVar13 = 0;
    if ((local_c8 & 1) == 0) {
      if (0x1c1 < version && profile != EEsProfile) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        append(&(this->super_TBuiltInParseables).commonBuiltins,
               "bool sparseTexelsResidentARB(int code);\n");
      }
      return;
    }
  } while( true );
}

Assistant:

void TBuiltIns::add2ndGenerationSamplingImaging(int version, EProfile profile, const SpvVersion& spvVersion)
{
    //
    // In this function proper, enumerate the types, then calls the next set of functions
    // to enumerate all the uses for that type.
    //

    // enumerate all the types
    const TBasicType bTypes[] = { EbtFloat, EbtInt, EbtUint,
         EbtFloat16
    };
    bool skipBuffer = (profile == EEsProfile && version < 310) || (profile != EEsProfile && version < 140);
    bool skipCubeArrayed = (profile == EEsProfile && version < 310) || (profile != EEsProfile && version < 130);
    for (int image = 0; image <= 1; ++image) // loop over "bool" image vs sampler
    {
        for (int shadow = 0; shadow <= 1; ++shadow) { // loop over "bool" shadow or not
            for (int ms = 0; ms <= 1; ++ms) // loop over "bool" multisample or not
            {
                if ((ms || image) && shadow)
                    continue;
                if (ms && profile != EEsProfile && version < 140)
                    continue;
                if (ms && image && profile == EEsProfile)
                    continue;
                if (ms && profile == EEsProfile && version < 310)
                    continue;

                for (int arrayed = 0; arrayed <= 1; ++arrayed) { // loop over "bool" arrayed or not
                    for (int dim = Esd1D; dim < EsdNumDims; ++dim) { // 1D, ..., buffer, subpass
                        if (dim == EsdAttachmentEXT)
                            continue;
                        if (dim == EsdSubpass && spvVersion.vulkan == 0)
                            continue;
                        if (dim == EsdSubpass && (image || shadow || arrayed))
                            continue;
                        if ((dim == Esd1D || dim == EsdRect) && profile == EEsProfile)
                            continue;
                        if (dim == EsdSubpass && spvVersion.vulkan == 0)
                            continue;
                        if (dim == EsdSubpass && (image || shadow || arrayed))
                            continue;
                        if ((dim == Esd1D || dim == EsdRect) && profile == EEsProfile)
                            continue;
                        if (dim != Esd2D && dim != EsdSubpass && ms)
                            continue;
                        if (dim == EsdBuffer && skipBuffer)
                            continue;
                        if (dim == EsdBuffer && (shadow || arrayed || ms))
                            continue;
                        if (ms && arrayed && profile == EEsProfile && version < 310)
                            continue;
                        if (dim == Esd3D && shadow)
                            continue;
                        if (dim == EsdCube && arrayed && skipCubeArrayed)
                            continue;
                        if ((dim == Esd3D || dim == EsdRect) && arrayed)
                            continue;

                        // Loop over the bTypes
                        for (size_t bType = 0; bType < sizeof(bTypes)/sizeof(TBasicType); ++bType) {
                            if (bTypes[bType] == EbtFloat16 && (profile == EEsProfile || version < 450))
                                continue;
                            if (dim == EsdRect && version < 140 && bType > 0)
                                continue;
                            if (shadow && (bTypes[bType] == EbtInt || bTypes[bType] == EbtUint))
                                continue;
                            //
                            // Now, make all the function prototypes for the type we just built...
                            //
                            TSampler sampler;
                            if (dim == EsdSubpass) {
                                sampler.setSubpass(bTypes[bType], ms ? true : false);
                            } else if (dim == EsdAttachmentEXT) {
                                sampler.setAttachmentEXT(bTypes[bType]);
                            } else
                            if (image) {
                                sampler.setImage(bTypes[bType], (TSamplerDim)dim, arrayed ? true : false,
                                                                                  shadow  ? true : false,
                                                                                  ms      ? true : false);
                            } else {
                                sampler.set(bTypes[bType], (TSamplerDim)dim, arrayed ? true : false,
                                                                             shadow  ? true : false,
                                                                             ms      ? true : false);
                            }

                            TString typeName = sampler.getString();

                            if (dim == EsdSubpass) {
                                addSubpassSampling(sampler, typeName, version, profile);
                                continue;
                            }

                            addQueryFunctions(sampler, typeName, version, profile);

                            if (image)
                                addImageFunctions(sampler, typeName, version, profile);
                            else {
                                addSamplingFunctions(sampler, typeName, version, profile);
                                addGatherFunctions(sampler, typeName, version, profile);
                                if (spvVersion.vulkan > 0 && sampler.isCombined() && !sampler.shadow) {
                                    // Base Vulkan allows texelFetch() for
                                    // textureBuffer (i.e. without sampler).
                                    //
                                    // GL_EXT_samplerless_texture_functions
                                    // allows texelFetch() and query functions
                                    // (other than textureQueryLod()) for all
                                    // texture types.
                                    sampler.setTexture(sampler.type, sampler.dim, sampler.arrayed, sampler.shadow,
                                                       sampler.ms);
                                    TString textureTypeName = sampler.getString();
                                    addSamplingFunctions(sampler, textureTypeName, version, profile);
                                    addQueryFunctions(sampler, textureTypeName, version, profile);
                                }
                            }
                        }
                    }
                }
            }
        }
    }

    //
    // sparseTexelsResidentARB()
    //
    if (profile != EEsProfile && version >= 450) {
        commonBuiltins.append("bool sparseTexelsResidentARB(int code);\n");
    }
}